

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
kj::Vector<capnp::compiler::CompilerMain::OutputDirective>::setCapacity
          (Vector<capnp::compiler::CompilerMain::OutputDirective> *this,size_t newSize)

{
  OutputDirective *pOVar1;
  RemoveConst<capnp::compiler::CompilerMain::OutputDirective> *pRVar2;
  OutputDirective *pOVar3;
  ulong uVar4;
  __off_t in_RDX;
  ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> newBuilder;
  ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> local_38;
  
  uVar4 = ((long)(this->builder).pos - (long)(this->builder).ptr >> 4) * -0x5555555555555555;
  if (newSize <= uVar4 && uVar4 - newSize != 0) {
    ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective>::truncate
              (&this->builder,(char *)newSize,in_RDX);
  }
  local_38.ptr = (OutputDirective *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x30,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.ptr + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_38.pos = local_38.ptr;
  local_38.pos = kj::_::
                 CopyConstructArray_<capnp::compiler::CompilerMain::OutputDirective,_capnp::compiler::CompilerMain::OutputDirective_*,_true,_false>
                 ::apply(local_38.ptr,(this->builder).ptr,(this->builder).pos);
  ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective>::operator=(&this->builder,&local_38);
  pOVar3 = local_38.endPtr;
  pRVar2 = local_38.pos;
  pOVar1 = local_38.ptr;
  if (local_38.ptr != (OutputDirective *)0x0) {
    local_38.ptr = (OutputDirective *)0x0;
    local_38.pos = (RemoveConst<capnp::compiler::CompilerMain::OutputDirective> *)0x0;
    local_38.endPtr = (OutputDirective *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pOVar1,0x30,
               ((long)pRVar2 - (long)pOVar1 >> 4) * -0x5555555555555555,
               ((long)pOVar3 - (long)pOVar1 >> 4) * -0x5555555555555555,
               ArrayDisposer::Dispose_<capnp::compiler::CompilerMain::OutputDirective>::destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }